

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SurfaceDiffusion.cpp
# Opt level: O3

void __thiscall OpenMD::SurfaceDiffusion::positionCorrelation(SurfaceDiffusion *this)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  vector<int,_std::allocator<int>_> *this_02;
  double *pdVar1;
  double *pdVar2;
  int *piVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer pvVar6;
  pointer pdVar7;
  pointer pdVar8;
  double dVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  size_type __new_size;
  ulong uVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  double dVar20;
  double tmp;
  double dVar21;
  Vector3d kPos;
  Vector<double,_3U> result;
  double local_98 [3];
  pointer local_80;
  long local_78;
  long local_70;
  double local_68 [4];
  double local_48 [3];
  
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  local_98[2] = 0.0;
  pdVar4 = (this->xHist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->xHist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar4) {
    (this->xHist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar4;
  }
  pdVar4 = (this->yHist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->yHist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar4) {
    (this->yHist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar4;
  }
  pdVar4 = (this->rHist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->rHist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar4) {
    (this->rHist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar4;
  }
  this_00 = &this->yHist_;
  this_01 = &this->rHist_;
  this_02 = &this->count_;
  piVar5 = (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar5) {
    (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar5;
  }
  pvVar6 = (this->positions2_).
           super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __new_size = (size_type)
               ((int)((ulong)((long)*(pointer *)
                                     ((long)&(pvVar6->
                                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                             )._M_impl.super__Vector_impl_data + 8) -
                             *(long *)&(pvVar6->
                                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                       )._M_impl.super__Vector_impl_data) >> 3) * -0x55555555);
  std::vector<double,_std::allocator<double>_>::resize(&this->xHist_,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size);
  std::vector<double,_std::allocator<double>_>::resize(this_01,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(this_02,__new_size);
  pvVar6 = (this->positions2_).
           super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar11 = (long)(this->positions2_).
                 super__Vector_base<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>,_std::allocator<std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar6;
  if (lVar11 != 0) {
    local_78 = (lVar11 >> 3) * -0x5555555555555555;
    local_80 = (this->moBool2_).
               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_78 = local_78 + (ulong)(local_78 == 0);
    lVar11 = 0;
    do {
      lVar18 = *(long *)&pvVar6[lVar11].
                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         ._M_impl;
      uVar10 = (int)((ulong)((long)*(pointer *)
                                    ((long)&pvVar6[lVar11].
                                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                            ._M_impl.super__Vector_impl_data + 8) - lVar18) >> 3) *
               -0x55555555 - 1;
      if (0 < (int)uVar10) {
        local_70 = *(long *)&local_80[lVar11].super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data;
        pdVar4 = (this->xHist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar8 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar5 = (this_02->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar13 = 0;
        do {
          uVar14 = uVar13 + 1;
          if (((*(ulong *)(local_70 + (uVar14 >> 6 & 0x3ffffff) * 8) >> (uVar14 & 0x3f) & 1) != 0)
             && (uVar15 = ((long)*(pointer *)
                                  ((long)&(pvVar6->
                                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                          )._M_impl.super__Vector_impl_data + 8) -
                           *(long *)&(pvVar6->
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     )._M_impl.super__Vector_impl_data >> 3) * -0x5555555555555555,
                uVar13 <= uVar15 && uVar15 - uVar13 != 0)) {
            pdVar1 = (double *)(lVar18 + uVar13 * 0x18);
            lVar12 = 0;
            uVar19 = uVar13;
            do {
              local_98[2] = (double)*(undefined8 *)(lVar18 + 0x10 + (lVar12 + uVar13) * 0x18);
              pdVar2 = (double *)(lVar18 + (lVar12 + uVar13) * 0x18);
              local_98[0] = *pdVar2;
              local_98[1] = pdVar2[1];
              local_68[0] = *pdVar1;
              local_68[1] = pdVar1[1];
              local_68[2] = pdVar1[2];
              dVar20 = local_98[0] - *pdVar1;
              dVar9 = local_98[1] - pdVar1[1];
              local_48[0] = 0.0;
              local_48[1] = 0.0;
              local_48[2] = 0.0;
              lVar17 = 0;
              do {
                local_48[lVar17] = local_98[lVar17] - local_68[lVar17];
                lVar17 = lVar17 + 1;
              } while (lVar17 != 3);
              dVar21 = 0.0;
              lVar17 = 0;
              do {
                dVar21 = dVar21 + local_48[lVar17] * local_48[lVar17];
                lVar17 = lVar17 + 1;
              } while (lVar17 != 3);
              iVar16 = (int)uVar19 - (int)uVar13;
              pdVar4[iVar16] = dVar20 * dVar20 + pdVar4[iVar16];
              pdVar7[iVar16] = dVar9 * dVar9 + pdVar7[iVar16];
              pdVar8[iVar16] = dVar21 + pdVar8[iVar16];
              piVar3 = piVar5 + iVar16;
              *piVar3 = *piVar3 + 1;
              uVar19 = uVar19 + 1;
              lVar12 = lVar12 + 1;
            } while (uVar19 < uVar15);
          }
          uVar13 = uVar14;
        } while (uVar14 != uVar10);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != local_78);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"X, Y, R calculated\n",0x13);
  pdVar4 = (this->xHist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar11 = (long)(this->xHist_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pdVar4;
  if (lVar11 != 0) {
    lVar11 = lVar11 >> 3;
    piVar5 = (this_02->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar18 = 0;
    do {
      dVar9 = (double)piVar5[lVar18];
      pdVar4[lVar18] = pdVar4[lVar18] / dVar9;
      pdVar7[lVar18] = pdVar7[lVar18] / dVar9;
      pdVar8[lVar18] = pdVar8[lVar18] / dVar9;
      lVar18 = lVar18 + 1;
    } while (lVar11 + (ulong)(lVar11 == 0) != lVar18);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"X, Y, R normalized\n",0x13);
  return;
}

Assistant:

void SurfaceDiffusion::positionCorrelation() {
    RealType xDist = 0.0;
    RealType yDist = 0.0;
    RealType rDist = 0.0;
    int timeShift  = 0;
    Vector3d kPos;
    Vector3d jPos;
    // biggest timeShift is positions2_[0].size() - 1?
    xHist_.clear();
    yHist_.clear();
    rHist_.clear();
    count_.clear();
    int frameResize = positions2_[0].size();
    xHist_.resize(frameResize);
    yHist_.resize(frameResize);
    rHist_.resize(frameResize);
    count_.resize(frameResize);
    // loop over particles
    // loop over frames starting at j
    //  loop over frames starting at k = j (time shift of 0)
    for (std::size_t i = 0; i < positions2_.size(); i++) {
      int frames = positions2_[i].size() - 1;  // for counting
                                               // properly, otherwise
                                               // moBool2_[i][j+1] will
                                               // go over
      for (int j = 0; j < frames; j++) {
        // if the particle is mobile between j and j + 1, then count
        // it for all timeShifts
        if (moBool2_[i][j + 1]) {
          for (std::size_t k = j; k < positions2_[0].size(); k++) {
            //<x(t)-x(0)>  <y(t)-y(0)>  <r(t)-r(0)>
            // The positions stored are not wrapped, thus I don't need
            // to worry about pbc
            // Mean square displacement
            // So I do want the squared distances

            kPos  = positions2_[i][k];
            jPos  = positions2_[i][j];
            xDist = kPos.x() - jPos.x();
            xDist = xDist * xDist;

            yDist = kPos.y() - jPos.y();
            yDist = yDist * yDist;

            rDist = (kPos - jPos).lengthSquare();

            timeShift = k - j;
            xHist_[timeShift] += xDist;
            yHist_[timeShift] += yDist;
            rHist_[timeShift] += rDist;
            count_[timeShift]++;
          }
        }
      }
    }
    cout << "X, Y, R calculated\n";

    for (std::size_t i = 0; i < xHist_.size(); i++) {
      xHist_[i] = xHist_[i] / (count_[i]);
      yHist_[i] = yHist_[i] / (count_[i]);
      rHist_[i] = rHist_[i] / (count_[i]);
    }
    cout << "X, Y, R normalized\n";
  }